

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::_internal_add_kernelsize
          (PoolingLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->kernelsize_,&local_8);
  return;
}

Assistant:

inline void PoolingLayerParams::_internal_add_kernelsize(uint64_t value) {
  kernelsize_.Add(value);
}